

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxUnicode.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_> *
Jinx::Impl::ReplaceUtf8CharsAtRange
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
           *__return_storage_ptr__,String *dest,String *source,pair<long,_long> *range)

{
  undefined8 *puVar1;
  size_type sVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  pointer utf8Str;
  long lVar6;
  char *utf8Str_00;
  char *pcVar7;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_60;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
  *local_40;
  pair<long,_long> *local_38;
  
  if (range->second < range->first) {
    LogWriteLine(Error,"First range index is greater than second");
  }
  else {
    utf8Str_00 = (dest->_M_dataplus)._M_p;
    sVar2 = dest->_M_string_length;
    pcVar3 = GetUtf8CstrByIndex(dest,range->first);
    pcVar4 = GetUtf8CstrByIndex(dest,range->second);
    if ((pcVar3 != (char *)0x0) && (pcVar4 != (char *)0x0)) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      local_60._M_string_length = 0;
      local_60.field_2._M_local_buf[0] = '\0';
      local_40 = __return_storage_ptr__;
      local_38 = range;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
                (&local_60,dest->_M_string_length);
      if (0 < (long)sVar2) {
        pcVar4 = utf8Str_00 + sVar2;
        do {
          if (utf8Str_00 == pcVar3) {
            if (0 < (long)source->_M_string_length) {
              utf8Str = (source->_M_dataplus)._M_p;
              pcVar7 = utf8Str + source->_M_string_length;
              do {
                for (sVar5 = GetUtf8CharSize(utf8Str); sVar5 != 0; sVar5 = sVar5 - 1) {
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                  push_back(&local_60,*utf8Str);
                  utf8Str = utf8Str + 1;
                }
              } while (utf8Str < pcVar7);
            }
            lVar6 = (local_38->second + 1) - local_38->first;
            if (lVar6 != 0) {
              lVar6 = lVar6 + (ulong)(lVar6 == 0);
              do {
                sVar5 = GetUtf8CharSize(utf8Str_00);
                utf8Str_00 = utf8Str_00 + sVar5;
                lVar6 = lVar6 + -1;
              } while (lVar6 != 0);
            }
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
            push_back(&local_60,*utf8Str_00);
            utf8Str_00 = utf8Str_00 + 1;
          }
        } while (utf8Str_00 < pcVar4);
      }
      puVar1 = (undefined8 *)
               ((long)&(local_40->
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
                       ._M_payload + 0x10);
      *(undefined8 **)
       &(local_40->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
        ._M_payload = puVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
           *)local_60._M_dataplus._M_p == &local_60.field_2) {
        *puVar1 = CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                           local_60.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(local_40->
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
                 ._M_payload + 0x18) = local_60.field_2._8_8_;
      }
      else {
        (local_40->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = local_60._M_dataplus._M_p;
        *(ulong *)((long)&(local_40->
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
                          )._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
                          ._M_payload + 0x10) =
             CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,local_60.field_2._M_local_buf[0])
        ;
      }
      (local_40->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
      ._M_payload._M_value._M_string_length = local_60._M_string_length;
      (local_40->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
      ._M_engaged = true;
      return local_40;
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
  ._M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

inline_t std::optional<String> ReplaceUtf8CharsAtRange(const String & dest, const String & source, const std::pair<int64_t, int64_t> & range)
	{
		if (range.first > range.second)
		{
			LogWriteLine(LogLevel::Error, "First range index is greater than second");
			return std::optional<String>();
		}
		const char * destStart = dest.c_str();
		const char * destEnd = destStart + dest.size();
		const char * targetStart = GetUtf8CstrByIndex(dest, range.first);
		const char * targetEnd = GetUtf8CstrByIndex(dest, range.second);
		if (targetStart == nullptr || targetEnd == nullptr)
			return std::optional<String>();
		String out;
		out.reserve(dest.size());
		const char * destCurr = destStart;
		while (destCurr < destEnd)
		{
			if (destCurr == targetStart)
			{
				const char * srcCurr = source.c_str();
				const char * srcEnd = srcCurr + source.size();
				while (srcCurr < srcEnd)
				{
					size_t charCount = GetUtf8CharSize(srcCurr);
					for (size_t i = 0; i < charCount; ++i)
					{
						out += *srcCurr;
						++srcCurr;
					}
				}
				size_t rangeCount = range.second - range.first + 1;
				for (size_t i = 0; i < rangeCount; ++i)
				{
					size_t size = GetUtf8CharSize(destCurr);
					destCurr += size;
				}
			}
			else
			{
				out += *destCurr;
				++destCurr;
			}
		}
		return out;
	}